

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allphone_search.c
# Opt level: O2

void allphone_clear_segments(allphone_search_t *allphs)

{
  glist_t pgVar1;
  glist_t *ppgVar2;
  glist_t *ppgVar3;
  
  ppgVar2 = &allphs->segments;
  ppgVar3 = ppgVar2;
  while (pgVar1 = *ppgVar3, pgVar1 != (glist_t)0x0) {
    ckd_free((pgVar1->data).ptr);
    ppgVar3 = &pgVar1->next;
  }
  glist_free(*ppgVar2);
  *ppgVar2 = (glist_t)0x0;
  return;
}

Assistant:

static void
allphone_clear_segments(allphone_search_t * allphs)
{	
    gnode_t *gn;
    for (gn = allphs->segments; gn; gn = gn->next) {
        ckd_free(gnode_ptr(gn));
    }
    glist_free(allphs->segments);
    allphs->segments = NULL;
}